

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockHierarchyTest_getMockSupportScope_TestShell::createTest
          (TEST_MockHierarchyTest_getMockSupportScope_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
                                  ,0x27);
  TEST_MockHierarchyTest_getMockSupportScope_Test::TEST_MockHierarchyTest_getMockSupportScope_Test
            ((TEST_MockHierarchyTest_getMockSupportScope_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockHierarchyTest, getMockSupportScope)
{
    MockSupport* mock1 = mock().getMockSupportScope("name");
    MockSupport* mock2 = mock().getMockSupportScope("differentName");

    CHECK(!mock().hasData("name"));
    CHECK(mock1 != mock2);
    POINTERS_EQUAL(mock1, mock().getMockSupportScope("name"));
    CHECK(mock1 != &mock());
}